

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

ImageT<unsigned_int,_4U> * __thiscall
ImageT<unsigned_int,_4U>::swizzle(ImageT<unsigned_int,_4U> *this,string_view swizzle)

{
  Color *pCVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  size_type sVar5;
  ImageT<unsigned_int,_4U> *in_RDI;
  uint32_t c;
  Color srcPixel;
  size_t i;
  ImageT<unsigned_int,_4U> *this_00;
  uint local_34;
  ImageT<unsigned_int,_4U> *local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  if (sVar5 == 4) {
    local_20 = (ImageT<unsigned_int,_4U> *)0x0;
    while( true ) {
      this_00 = local_20;
      uVar2 = Image::getPixelCount(&in_RDI->super_Image);
      if ((ImageT<unsigned_int,_4U> *)(ulong)uVar2 <= this_00) break;
      local_34 = 0;
      while( true ) {
        uVar4 = local_34;
        uVar3 = (*(in_RDI->super_Image)._vptr_Image[5])();
        if (uVar3 <= uVar4) break;
        pCVar1 = in_RDI->pixels;
        uVar3 = local_34;
        std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_10,(ulong)local_34)
        ;
        uVar4 = swizzlePixel(this_00,(Color *)CONCAT44(uVar4,uVar3),
                             (char)((ulong)(pCVar1 + (long)local_20) >> 0x38));
        color<unsigned_int,_4U>::set(pCVar1 + (long)local_20,uVar3,uVar4);
        local_34 = local_34 + 1;
      }
      local_20 = (ImageT<unsigned_int,_4U> *)((long)&(local_20->super_Image)._vptr_Image + 1);
    }
    return in_RDI;
  }
  __assert_fail("swizzle.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x4fe,
                "virtual ImageT<componentType, componentCount> &ImageT<unsigned int, 4>::swizzle(std::string_view) [componentType = unsigned int, componentCount = 4]"
               );
}

Assistant:

virtual ImageT& swizzle(std::string_view swizzle) override {
        assert(swizzle.size() == 4);
        for (size_t i = 0; i < getPixelCount(); i++) {
            Color srcPixel = pixels[i];
            for (uint32_t c = 0; c < getComponentCount(); c++) {
                pixels[i].set(c, swizzlePixel(srcPixel, swizzle[c]));
            }
        }
        return *this;
    }